

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void iterator_suite::test_const_iterator(void)

{
  basic_iterator<const_int> first_end;
  bool bVar1;
  reference piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  initializer_list<int> __l;
  basic_iterator<const_int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  allocator_type local_a1;
  vector<int,_std::allocator<int>_> local_a0;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  iterator_type local_78;
  circular_view<int,_18446744073709551615UL> local_68;
  type local_48 [6];
  
  local_68.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_68.member.cap = 4;
  local_68.member.size = 0;
  local_68.member.next = 4;
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_68,1);
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::back(&local_68);
  *piVar2 = 0xb;
  local_78.current = local_68.member.cap * 2;
  uVar4 = local_78.current - (local_68.member.cap & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar4 >> 0x38 < 2) {
    local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)(local_78.current - 1 & local_68.member.next - local_68.member.size);
  }
  else {
    local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)((local_68.member.next - local_68.member.size) % local_78.current);
  }
  if ((byte)(uVar4 >> 0x38) < 2) {
    local_78.current = local_78.current - 1 & local_68.member.next;
  }
  else {
    local_78.current = local_68.member.next % local_78.current;
  }
  local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_68;
  local_78.parent = &local_68;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator==
                    ((basic_iterator<const_int> *)&local_a0,&local_78);
  boost::detail::test_impl
            ("span.cbegin() != span.cend()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x28c,"void iterator_suite::test_const_iterator()",!bVar1);
  local_78.parent = (view_pointer)CONCAT44(local_78.parent._4_4_,0xb);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_a1);
  uVar4 = local_68.member.cap * 2;
  uVar3 = uVar4 - (local_68.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar5 = uVar4 - 1 & local_68.member.next - local_68.member.size;
  }
  else {
    uVar5 = (local_68.member.next - local_68.member.size) % uVar4;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_80 = uVar4 - 1 & local_68.member.next;
  }
  else {
    sStack_80 = local_68.member.next % uVar4;
  }
  first_end.current = sStack_80;
  first_end.parent = &local_68;
  first_begin.current = uVar5;
  first_begin.parent = &local_68;
  local_88 = &local_68;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x290,"void iterator_suite::test_const_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if ((view_pointer)
      local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_const_iterator()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    BOOST_TEST(span.cbegin() != span.cend());
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.cbegin(), span.cend(),
                          expect.begin(), expect.end());
    }
}